

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cose.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::cose::Sign1Message::Sign
          (Error *__return_storage_ptr__,Sign1Message *this,mbedtls_pk_context *aPrivateKey)

{
  char cVar1;
  _Bool _Var2;
  int iVar3;
  mbedtls_pk_type_t mVar4;
  char *pcVar5;
  char *pcVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  writer write;
  string local_b0;
  writer local_90;
  format_string_checker<char> local_88;
  ErrorCode local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  iVar3 = mbedtls_pk_can_do(aPrivateKey,MBEDTLS_PK_ECDSA);
  if (iVar3 != 0) {
    local_88.context_.super_basic_format_parse_context<char>.format_str_.size_ =
         *(size_t *)&aPrivateKey->priv_id;
    local_88._0_8_ = aPrivateKey->pk_info;
    local_88.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         (char *)aPrivateKey->pk_ctx;
    mVar4 = mbedtls_pk_get_type((mbedtls_pk_context *)&local_88);
    if ((eckey_t_conflict *)
        local_88.context_.super_basic_format_parse_context<char>.format_str_.data_ !=
        (eckey_t_conflict *)0x0 && 0xfffffffc < mVar4 - MBEDTLS_PK_RSA_ALT) {
      _Var2 = COSE_Sign0_Sign_eckey
                        (this->mSign,
                         (eckey_t_conflict *)
                         local_88.context_.super_basic_format_parse_context<char>.format_str_.data_,
                         (cose_errback *)0x0);
      if (_Var2) {
        return __return_storage_ptr__;
      }
      local_88._0_8_ = local_88._0_8_ & 0xffffffff00000000;
      local_88.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "sign COSE SIGN1 message failed";
      local_88.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1e;
      local_88.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_88.context_.super_basic_format_parse_context<char>._20_4_ = 0;
      local_88.parse_funcs_[0] = (parse_func)0x0;
      pcVar5 = "sign COSE SIGN1 message failed";
      local_88.context_.types_ = local_88.types_;
      do {
        pcVar6 = pcVar5 + 1;
        if (*pcVar5 == '}') {
          if ((pcVar6 == "") || (*pcVar6 != '}')) {
            fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar6 = pcVar5 + 2;
        }
        else if (*pcVar5 == '{') {
          pcVar6 = fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar5,"",&local_88);
        }
        pcVar5 = pcVar6;
      } while (pcVar6 != "");
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)&local_88;
      fmt::v10::vformat_abi_cxx11_
                (&local_b0,(v10 *)"sign COSE SIGN1 message failed",(string_view)ZEXT816(0x1e),
                 args_00);
      local_58 = kSecurity;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,local_b0._M_dataplus._M_p,
                 local_b0._M_dataplus._M_p + local_b0._M_string_length);
      goto LAB_001d5af9;
    }
  }
  local_88._0_8_ = local_88._0_8_ & 0xffffffff00000000;
  pcVar5 = "sign COSE SIGN1 message without valid EC private key";
  local_88.context_.super_basic_format_parse_context<char>.format_str_.data_ =
       "sign COSE SIGN1 message without valid EC private key";
  local_88.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x34;
  local_88.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
  local_88.context_.super_basic_format_parse_context<char>._20_4_ = 0;
  local_88.parse_funcs_[0] = (parse_func)0x0;
  local_90.handler_ = &local_88;
  local_88.context_.types_ = local_88.types_;
  do {
    cVar1 = *pcVar5;
    pcVar6 = pcVar5;
    while (cVar1 != '{') {
      pcVar6 = pcVar6 + 1;
      if (pcVar6 == "") {
        fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_90,pcVar5,"");
        goto LAB_001d5ab0;
      }
      cVar1 = *pcVar6;
    }
    fmt::v10::detail::
    parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
    operator()(&local_90,pcVar5,pcVar6);
    pcVar5 = fmt::v10::detail::
             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                       (pcVar6,"",&local_88);
  } while (pcVar5 != "");
LAB_001d5ab0:
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_88;
  fmt::v10::vformat_abi_cxx11_
            (&local_b0,(v10 *)"sign COSE SIGN1 message without valid EC private key",
             (string_view)ZEXT816(0x34),args);
  local_58 = kInvalidArgs;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,local_b0._M_dataplus._M_p,
             local_b0._M_dataplus._M_p + local_b0._M_string_length);
LAB_001d5af9:
  __return_storage_ptr__->mCode = local_58;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Sign1Message::Sign(const mbedtls_pk_context &aPrivateKey)
{
    Error                      error;
    const mbedtls_ecp_keypair *eckey = nullptr;

    // Accepts only EC keys
    VerifyOrExit(mbedtls_pk_can_do(&aPrivateKey, MBEDTLS_PK_ECDSA) && (eckey = mbedtls_pk_ec(aPrivateKey)) != nullptr,
                 error = ERROR_INVALID_ARGS("sign COSE SIGN1 message without valid EC private key"));

    VerifyOrExit(COSE_Sign0_Sign_eckey(mSign, eckey, nullptr),
                 error = ERROR_SECURITY("sign COSE SIGN1 message failed"));

exit:
    return error;
}